

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHeat2D_kry.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  N_Vector uu;
  N_Vector up;
  N_Vector p_Var2;
  long lVar3;
  UserData paVar4;
  N_Vector p_Var5;
  void *mem;
  char *pcVar6;
  int iVar7;
  sunrealtype rtol;
  double dVar8;
  sunrealtype atol;
  SUNContext ctx;
  long ncfl;
  long ncfn;
  long netf;
  sunrealtype tret;
  undefined8 local_80;
  double local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  sunrealtype local_58;
  long local_50;
  N_Vector local_48;
  UserData local_40;
  void *local_38;
  
  uVar1 = SUNContext_Create(0,&local_80);
  if ((int)uVar1 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    uu = (N_Vector)N_VNew_Serial(100,local_80);
    if (uu == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    up = (N_Vector)N_VClone(uu);
    if (up == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    p_Var2 = (N_Vector)N_VClone(uu);
    if (p_Var2 == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    lVar3 = N_VClone(uu);
    if (lVar3 == 0) {
      main_cold_4();
      return 1;
    }
    paVar4 = (UserData)malloc(0x20);
    paVar4->pp = (N_Vector)0x0;
    paVar4->mm = 10;
    paVar4->dx = 0.1111111111111111;
    paVar4->coeff = 81.0;
    p_Var5 = (N_Vector)N_VClone(uu);
    paVar4->pp = p_Var5;
    if (p_Var5 == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    SetInitialProfile(paVar4,uu,up,p_Var2);
    N_VConst(0x3ff0000000000000,lVar3);
    mem = (void *)IDACreate(local_80);
    local_38 = mem;
    if (mem == (void *)0x0) {
      main_cold_2();
      return 1;
    }
    uVar1 = IDASetUserData(mem,paVar4);
    if ((int)uVar1 < 0) {
      pcVar6 = "IDASetUserData";
    }
    else {
      uVar1 = IDASetConstraints(mem,lVar3);
      if ((int)uVar1 < 0) {
        pcVar6 = "IDASetConstraints";
      }
      else {
        N_VDestroy(lVar3);
        uVar1 = IDAInit(0,mem,resHeat,uu,up);
        if ((int)uVar1 < 0) {
          pcVar6 = "IDAInit";
        }
        else {
          atol = 0.001;
          uVar1 = IDASStolerances(0,mem);
          if ((int)uVar1 < 0) {
            pcVar6 = "IDASStolerances";
          }
          else {
            local_40 = paVar4;
            lVar3 = SUNLinSol_SPGMR(uu,1,0,local_80);
            if (lVar3 == 0) {
              main_cold_1();
              return 1;
            }
            uVar1 = SUNLinSol_SPGMRSetMaxRestarts(lVar3,5);
            if ((int)uVar1 < 0) {
              pcVar6 = "SUNLinSol_SPGMRSetMaxRestarts";
            }
            else {
              uVar1 = IDASetLinearSolver(mem,lVar3,0);
              if ((int)uVar1 < 0) {
                pcVar6 = "IDASetLinearSolver";
              }
              else {
                uVar1 = IDASetPreconditioner(mem,PsetupHeat,PsolveHeat);
                if ((int)uVar1 < 0) {
                  pcVar6 = "IDASetPreconditioner";
                }
                else {
                  local_50 = lVar3;
                  local_48 = p_Var2;
                  PrintHeader(rtol,atol);
                  puts("\n\nCase 1: gsytpe = SUN_MODIFIED_GS");
                  puts("\n   Output Summary (umax = max-norm of solution) \n");
                  puts("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps");
                  puts("----------------------------------------------------------------------");
                  paVar4 = local_40;
                  dVar8 = 0.01;
                  iVar7 = 0xb;
                  do {
                    local_78 = dVar8;
                    uVar1 = IDASolve(mem,&local_58,uu,up,1);
                    if ((int)uVar1 < 0) goto LAB_001029a3;
                    PrintOutput(mem,local_58,uu);
                    dVar8 = local_78 + local_78;
                    iVar7 = iVar7 + -1;
                  } while (iVar7 != 0);
                  uVar1 = IDAGetNumErrTestFails(mem,&local_60);
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                            "IDAGetNumErrTestFails",(ulong)uVar1);
                  }
                  uVar1 = IDAGetNumNonlinSolvConvFails(mem,&local_68);
                  p_Var2 = local_48;
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                            "IDAGetNumNonlinSolvConvFails",(ulong)uVar1);
                  }
                  uVar1 = IDAGetNumLinConvFails(mem,&local_70);
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                            "IDAGetNumLinConvFails",(ulong)uVar1);
                  }
                  printf("\nError test failures            = %ld\n",local_60);
                  printf("Nonlinear convergence failures = %ld\n",local_68);
                  printf("Linear convergence failures    = %ld\n",local_70);
                  SetInitialProfile(paVar4,uu,up,p_Var2);
                  uVar1 = IDAReInit(0,mem,uu,up);
                  if ((int)uVar1 < 0) {
                    pcVar6 = "IDAReInit";
                  }
                  else {
                    uVar1 = SUNLinSol_SPGMRSetGSType(local_50,2);
                    if ((int)uVar1 < 0) {
                      pcVar6 = "SUNLinSol_SPGMRSetGSType";
                    }
                    else {
                      puts("\n\nCase 2: gstype = SUN_CLASSICAL_GS");
                      puts("\n   Output Summary (umax = max-norm of solution) \n");
                      puts("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps")
                      ;
                      puts("----------------------------------------------------------------------")
                      ;
                      dVar8 = 0.01;
                      iVar7 = 0xb;
                      while (local_78 = dVar8, uVar1 = IDASolve(mem,&local_58,uu,up,1),
                            -1 < (int)uVar1) {
                        PrintOutput(mem,local_58,uu);
                        dVar8 = local_78 + local_78;
                        iVar7 = iVar7 + -1;
                        if (iVar7 == 0) {
                          uVar1 = IDAGetNumErrTestFails(mem,&local_60);
                          if ((int)uVar1 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "IDAGetNumErrTestFails",(ulong)uVar1);
                          }
                          uVar1 = IDAGetNumNonlinSolvConvFails(mem,&local_68);
                          p_Var2 = local_48;
                          if ((int)uVar1 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "IDAGetNumNonlinSolvConvFails",(ulong)uVar1);
                          }
                          uVar1 = IDAGetNumLinConvFails(mem,&local_70);
                          if ((int)uVar1 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "IDAGetNumLinConvFails",(ulong)uVar1);
                          }
                          printf("\nError test failures            = %ld\n",local_60);
                          printf("Nonlinear convergence failures = %ld\n",local_68);
                          printf("Linear convergence failures    = %ld\n",local_70);
                          IDAFree(&local_38);
                          SUNLinSolFree(local_50);
                          N_VDestroy(uu);
                          N_VDestroy(up);
                          N_VDestroy(p_Var2);
                          paVar4 = local_40;
                          N_VDestroy(local_40->pp);
                          free(paVar4);
                          SUNContext_Free(&local_80);
                          return 0;
                        }
                      }
LAB_001029a3:
                      pcVar6 = "IDASolve";
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = res = NULL;
  LS                          = NULL;

  /* Create the SUNDIALS context object for this simulation */

  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create the linear solver SUNLinSol_SPGMR with left preconditioning
     and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* IDA recommends allowing up to 5 restarts (default is 0) */
  retval = SUNLinSol_SPGMRSetMaxRestarts(LS, 5);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

  /* Attach the linear sovler */
  retval = IDASetLinearSolver(mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
  if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  /*
   * -------------------------------------------------------------------------
   * CASE I
   * -------------------------------------------------------------------------
   */

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 1: gsytpe = SUN_MODIFIED_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /*
   * -------------------------------------------------------------------------
   * CASE II
   * -------------------------------------------------------------------------
   */

  /* Re-initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Re-initialize IDA and SPGMR */

  retval = IDAReInit(mem, t0, uu, up);
  if (check_retval(&retval, "IDAReInit", 1)) { return (1); }

  retval = SUNLinSol_SPGMRSetGSType(LS, SUN_CLASSICAL_GS);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 2: gstype = SUN_CLASSICAL_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}